

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::MetalMaterial__sample
          (embree *this,ISPCMetalMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,
          DifferentialGeometry *dg,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined1 auVar1 [16];
  BRDF *brdf_00;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar8;
  float fVar9;
  undefined4 uVar6;
  float fVar7;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [12];
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar17 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  vfloat4 a;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  Vec3fa VVar31;
  undefined8 uVar10;
  
  uVar10 = 0;
  if (0.0 < (wo->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
            (wo->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
            (wo->field_0).m128[0] * (dg->Ns).field_0.m128[0]) {
    fVar2 = This->roughness;
    auVar11 = rcpss(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    fVar12 = (2.0 - fVar2 * auVar11._0_4_) * auVar11._0_4_;
    fVar7 = (s->field_0).field_0.x * 6.2831855;
    fVar13 = fVar12 + 1.0;
    fVar2 = powf((s->field_0).field_0.y,1.0 / fVar13);
    fVar8 = 1.0 - fVar2 * fVar2;
    if (fVar8 <= 0.0) {
      fVar8 = 0.0;
    }
    fVar3 = sinf(fVar7);
    fVar4 = cosf(fVar7);
    fVar4 = fVar4 * SQRT(fVar8);
    fVar3 = fVar3 * SQRT(fVar8);
    fVar7 = (dg->Ns).field_0.m128[0];
    fVar8 = (dg->Ns).field_0.m128[2];
    fVar9 = -(dg->Ns).field_0.m128[1];
    fVar25 = -fVar8;
    auVar14._8_4_ = 0xffffffff;
    auVar14._0_8_ = 0xffffffffffffffff;
    if (fVar9 * fVar9 + fVar8 * fVar8 + 0.0 <= fVar7 * fVar7 + fVar25 * fVar25 + 0.0) {
      auVar14 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar8 = (float)((uint)fVar8 & auVar14._4_4_);
    fVar25 = (float)(~auVar14._0_4_ & (uint)fVar25);
    fVar20 = (float)(~auVar14._8_4_ & (uint)fVar7 | (uint)fVar9 & auVar14._8_4_);
    fVar7 = fVar8 * fVar8;
    fVar9 = fVar20 * fVar20;
    fVar26 = fVar7 + fVar25 * fVar25 + fVar9;
    fVar27 = fVar7 + fVar7 + 0.0;
    fVar9 = fVar7 + fVar9 + fVar9;
    fVar7 = fVar7 + 0.0 + 0.0;
    auVar28._4_4_ = fVar27;
    auVar28._0_4_ = fVar26;
    auVar28._8_4_ = fVar9;
    auVar28._12_4_ = fVar7;
    auVar11._4_4_ = fVar27;
    auVar11._0_4_ = fVar26;
    auVar11._8_4_ = fVar9;
    auVar11._12_4_ = fVar7;
    auVar11 = rsqrtss(auVar28,auVar11);
    fVar7 = auVar11._0_4_;
    fVar15 = fVar7 * 1.5 - fVar7 * fVar7 * fVar26 * 0.5 * fVar7;
    fVar25 = fVar15 * fVar25;
    fVar8 = fVar15 * fVar8;
    fVar20 = fVar15 * fVar20;
    fVar15 = fVar15 * 0.0;
    fVar7 = (dg->Ns).field_0.m128[0];
    fVar9 = (dg->Ns).field_0.m128[1];
    fVar26 = (dg->Ns).field_0.m128[2];
    fVar27 = (dg->Ns).field_0.m128[3];
    fVar16 = fVar8 * fVar7 - fVar9 * fVar25;
    fVar18 = fVar20 * fVar9 - fVar26 * fVar8;
    fVar21 = fVar25 * fVar26 - fVar7 * fVar20;
    fVar23 = fVar15 * fVar27 - fVar27 * fVar15;
    fVar19 = fVar18 * fVar18;
    fVar22 = fVar21 * fVar21;
    fVar24 = fVar23 * fVar23;
    fVar29 = fVar22 + fVar19 + fVar16 * fVar16;
    fVar30 = fVar24 + fVar19 + fVar19;
    fVar22 = fVar22 + fVar19 + fVar22;
    fVar24 = fVar24 + fVar19 + fVar24;
    auVar17._4_4_ = fVar30;
    auVar17._0_4_ = fVar29;
    auVar17._8_4_ = fVar22;
    auVar17._12_4_ = fVar24;
    auVar1._4_4_ = fVar30;
    auVar1._0_4_ = fVar29;
    auVar1._8_4_ = fVar22;
    auVar1._12_4_ = fVar24;
    auVar11 = rsqrtss(auVar17,auVar1);
    fVar19 = auVar11._0_4_;
    fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * fVar29 * 0.5 * fVar19;
    fVar25 = fVar4 * fVar25 + fVar2 * fVar7 + fVar3 * fVar19 * fVar18;
    fVar18 = fVar4 * fVar8 + fVar2 * fVar9 + fVar3 * fVar19 * fVar21;
    fVar26 = fVar4 * fVar20 + fVar2 * fVar26 + fVar3 * fVar19 * fVar16;
    fVar7 = powf(fVar2,fVar12);
    auVar11 = *(undefined1 (*) [16])(wo->field_0).m128;
    uVar10 = auVar11._0_8_;
    fVar8 = auVar11._8_4_ * fVar26 + auVar11._4_4_ * fVar18 + auVar11._0_4_ * fVar25;
    fVar12 = fVar8 + fVar8;
    fVar9 = fVar12 * fVar25 - auVar11._0_4_;
    fVar25 = fVar12 * fVar18 - auVar11._4_4_;
    fVar26 = fVar12 * fVar26 - auVar11._8_4_;
    (wi_o->v).field_0.m128[0] = fVar9;
    (wi_o->v).field_0.m128[1] = fVar25;
    (wi_o->v).field_0.m128[2] = fVar26;
    (wi_o->v).field_0.m128[3] =
         fVar12 * (fVar4 * fVar15 + fVar2 * fVar27 + fVar3 * fVar19 * fVar23) - auVar11._12_4_;
    wi_o->pdf = (fVar7 * fVar13 * 0.15915494) / (ABS(fVar8) * 4.0);
    if (0.0 < fVar26 * (dg->Ns).field_0.m128[2] +
              fVar25 * (dg->Ns).field_0.m128[1] + fVar9 * (dg->Ns).field_0.m128[0]) {
      VVar31 = MetalMaterial__eval(this,This,brdf_00,wo,dg,&wi_o->v);
      uVar10 = VVar31.field_0._8_8_;
      uVar5 = VVar31.field_0._0_4_;
      uVar6 = VVar31.field_0._4_4_;
      goto LAB_001221f1;
    }
  }
  uVar5 = 0;
  uVar6 = 0;
  *(undefined8 *)&(wi_o->v).field_0 = 0;
  *(undefined8 *)((long)&(wi_o->v).field_0 + 8) = 0;
  wi_o->pdf = 0.0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_001221f1:
  VVar31.field_0.m128[1] = (float)uVar6;
  VVar31.field_0.m128[0] = (float)uVar5;
  VVar31.field_0._8_8_ = uVar10;
  return (Vec3fa)VVar31.field_0;
}

Assistant:

Vec3fa MetalMaterial__sample(ISPCMetalMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  const PowerCosineDistribution distribution = make_PowerCosineDistribution(rcp(This->roughness));

  if (dot(wo,dg.Ns) <= 0.0f) { wi_o = make_Sample3f(Vec3fa(0.0f),0.0f); return Vec3fa(0.f); }
  sample(distribution,wo,dg.Ns,wi_o,s);
  if (dot(wi_o.v,dg.Ns) <= 0.0f) { wi_o = make_Sample3f(Vec3fa(0.0f),0.0f); return Vec3fa(0.f); }
  return MetalMaterial__eval(This,brdf,wo,dg,wi_o.v);
}